

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.hpp
# Opt level: O2

void van_kampen::utility::
     print<int_const&,char_const(&)[2],std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,char_const(&)[4]>
               (ostream *os,int *args,char (*args_1) [2],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
               char (*args_5) [4])

{
  ostream *poVar1;
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)os,*args);
  poVar1 = std::operator<<(poVar1,*args_1);
  poVar1 = std::operator<<(poVar1,(string *)args_2);
  poVar1 = std::operator<<(poVar1,(string *)args_3);
  poVar1 = std::operator<<(poVar1,(string *)args_4);
  std::operator<<(poVar1,*args_5);
  std::ostream::flush();
  return;
}

Assistant:

void print(std::ostream &os, ToPrint &&... args)
        {
            (os << ... << args);
            os.flush();
        }